

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging_tests.c
# Opt level: O1

void failure_reported_and_exception_thrown_when_messaging_would_block(void)

{
  char cVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  int iVar4;
  char panic_message [1000];
  undefined1 auStack_408 [1008];
  
  uVar2 = start_cgreen_messaging(0x21);
  signal_received = '\0';
  __sysv_signal(0xd,catch_signal);
  panic_set_output_buffer(auStack_408);
  iVar4 = 0;
  do {
    send_cgreen_message(uVar2,99);
    cVar1 = signal_received;
    if (signal_received != '\0') goto LAB_0010133b;
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x10001);
  iVar4 = 0x10001;
LAB_0010133b:
  uVar3 = create_equal_to_value_constraint(1,"1");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/messaging_tests.c"
               ,0x3c,"signal_received",cVar1,uVar3);
  uVar3 = create_less_than_value_constraint(0x10001,"LOOPS");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/messaging_tests.c"
               ,0x3d,"loop",iVar4,uVar3);
  uVar3 = create_contains_string_constraint("Too many assertions","\"Too many assertions\"");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/messaging_tests.c"
               ,0x3e,"panic_message",auStack_408,uVar3);
  return;
}

Assistant:

Ensure(failure_reported_and_exception_thrown_when_messaging_would_block) {
    const int LOOPS = 65537;
    int messaging = start_cgreen_messaging(33);
    int loop;
    char panic_message[1000];

    signal_received = 0;
    signal(SIGPIPE, catch_signal);

    panic_set_output_buffer(panic_message);

    for (loop = 0; loop < LOOPS; loop++) {
        send_cgreen_message(messaging, 99);
        if (signal_received == 1)
            break;
    }

    assert_that(signal_received, is_equal_to(1));
    assert_that(loop, is_less_than(LOOPS));
    assert_that(panic_message, contains_string("Too many assertions"));
}